

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::local_datetime(sequence *__return_storage_ptr__,spec *s)

{
  sequence local_70;
  character_either local_50;
  sequence local_30;
  
  local_date(&local_30,s);
  time_delim(&local_50,s);
  local_time(&local_70,s);
  sequence::sequence<toml::detail::sequence,toml::detail::character_either,toml::detail::sequence>
            (__return_storage_ptr__,&local_30,&local_50,&local_70);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_70.others_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_50.chars_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_30.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence local_datetime(const spec& s)
{
    return sequence(local_date(s), time_delim(s), local_time(s));
}